

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long *plVar1;
  char *pcVar2;
  size_type in_R9;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  string_view src;
  UntypedFormatSpecImpl format;
  size_type __dnew;
  string local_40;
  string *local_20;
  code *local_18;
  
  plVar1 = *(long **)this;
  if ((char *)*plVar1 == (char *)plVar1[1]) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_40._M_dataplus._M_p = (pointer)0x23;
    pcVar2 = (char *)std::__cxx11::string::_M_create
                               ((ulong *)__return_storage_ptr__,(ulong)&local_40);
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_40._M_dataplus._M_p;
    builtin_strncpy(pcVar2,"wrong number of variable delimiters",0x23);
    __return_storage_ptr__->_M_string_length = (size_type)local_40._M_dataplus._M_p;
    pcVar2[(long)local_40._M_dataplus._M_p] = '\0';
  }
  else {
    src._M_str = (char *)*plVar1;
    src._M_len = *(size_t *)(plVar1[1] + -0x10);
    CHexEscape_abi_cxx11_(&local_40,*(lts_20250127 **)(plVar1[1] + -0x18),src);
    local_18 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
    args.len_ = in_R9;
    args.ptr_ = (pointer)0x1;
    format.size_ = (size_t)&local_20;
    format.data_ = (void *)0x1c;
    local_20 = &local_40;
    str_format_internal::FormatPack_abi_cxx11_
              (__return_storage_ptr__,(str_format_internal *)"unclosed variable name: `%s`",format,
               args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}